

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O1

void av1_dist_wtd_convolve_x_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  short *psVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined3 uVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [13];
  undefined1 auVar72 [13];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [13];
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [13];
  undefined1 auVar93 [13];
  undefined1 auVar94 [13];
  unkuint9 Var95;
  undefined1 auVar96 [13];
  ushort uVar97;
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [13];
  undefined3 uVar109;
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  uint uVar130;
  undefined5 uVar131;
  undefined1 auVar132 [12];
  undefined1 auVar133 [12];
  undefined1 auVar134 [14];
  undefined1 auVar135 [14];
  uint5 uVar136;
  uint uVar137;
  undefined1 (*pauVar138) [16];
  ulong uVar139;
  char cVar140;
  int iVar141;
  int iVar142;
  undefined1 (*pauVar143) [16];
  ulong uVar144;
  long lVar145;
  int iVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  short sVar150;
  short sVar151;
  undefined1 auVar149 [16];
  short sVar152;
  short sVar154;
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  byte bVar179;
  undefined1 uVar180;
  undefined1 uVar181;
  byte bVar182;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined4 uVar192;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 uVar198;
  undefined1 uVar199;
  undefined1 uVar200;
  undefined1 uVar201;
  undefined1 in_XMM13 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  uint3 uVar202;
  undefined1 uVar206;
  undefined1 uVar207;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  short sVar208;
  short sVar219;
  short sVar220;
  short sVar222;
  short sVar224;
  short sVar225;
  short sVar226;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  short sVar227;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar166 [16];
  undefined1 auVar174 [16];
  undefined1 auVar167 [16];
  undefined1 auVar175 [16];
  undefined1 auVar168 [16];
  undefined1 auVar176 [16];
  undefined1 uVar221;
  undefined1 uVar223;
  
  iVar142 = 7 - conv_params->round_1;
  pauVar143 = (undefined1 (*) [16])conv_params->dst;
  iVar141 = conv_params->round_0 + conv_params->round_1;
  cVar140 = (char)iVar141;
  piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
  uVar83 = *(undefined4 *)piVar1;
  uVar84 = *(undefined4 *)(piVar1 + 2);
  uVar85 = *(undefined4 *)(piVar1 + 4);
  uVar192 = *(undefined4 *)(piVar1 + 6);
  iVar3 = conv_params->dst_stride;
  pauVar138 = (undefined1 (*) [16])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
  iVar146 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  auVar147 = ZEXT416((uint)conv_params->round_0);
  auVar148._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  auVar148._4_4_ = auVar148._0_4_;
  auVar148._8_4_ = auVar148._0_4_;
  auVar148._12_4_ = auVar148._0_4_;
  auVar149 = ZEXT416((uint)((1 << (0x15U - cVar140 & 0x1f)) + (1 << (0x16U - cVar140 & 0x1f))));
  uVar137 = 0xe - iVar141;
  auVar153 = ZEXT416((uint)(1 << ((byte)uVar137 & 0x1f)) >> 1);
  iVar141 = conv_params->do_average;
  iVar4 = conv_params->use_dist_wtd_comp_avg;
  auVar149 = pshuflw(auVar149,auVar149,0);
  auVar153 = pshuflw(auVar153,auVar153,0);
  auVar155._4_4_ = uVar192;
  auVar155._0_4_ = uVar192;
  auVar155._8_4_ = uVar192;
  auVar155._12_4_ = uVar192;
  sVar150 = auVar149._2_2_;
  sVar151 = auVar149._0_2_;
  sVar152 = auVar153._0_2_;
  sVar154 = auVar153._2_2_;
  if (w == 4) {
    do {
      auVar149 = *pauVar138;
      bVar182 = auVar149[7];
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar149._0_13_;
      auVar8[0xe] = bVar182;
      uVar181 = auVar149[6];
      auVar20[0xc] = uVar181;
      auVar20._0_12_ = auVar149._0_12_;
      auVar20._13_2_ = auVar8._13_2_;
      uVar30 = auVar20._12_3_;
      auVar31[0xb] = 0;
      auVar31._0_11_ = auVar149._0_11_;
      auVar31._12_3_ = uVar30;
      uVar180 = auVar149[5];
      auVar42[10] = uVar180;
      auVar42._0_10_ = auVar149._0_10_;
      auVar42._11_4_ = auVar31._11_4_;
      auVar51[9] = 0;
      auVar51._0_9_ = auVar149._0_9_;
      auVar51._10_5_ = auVar42._10_5_;
      bVar179 = auVar149[4];
      auVar62[8] = bVar179;
      auVar62._0_8_ = auVar149._0_8_;
      auVar62._9_6_ = auVar51._9_6_;
      auVar159[7] = 0;
      auVar159._0_7_ = auVar62._8_7_;
      auVar86._7_8_ = 0;
      auVar86._0_7_ = auVar62._8_7_;
      auVar87._8_7_ = 0;
      auVar87._0_8_ = SUB158(auVar86 << 0x40,7);
      auVar88._9_6_ = 0;
      auVar88._0_9_ = SUB159(auVar87 << 0x38,6);
      auVar89._10_5_ = 0;
      auVar89._0_10_ = SUB1510(auVar88 << 0x30,5);
      auVar90._11_4_ = 0;
      auVar90._0_11_ = SUB1511(auVar89 << 0x28,4);
      auVar91._12_3_ = 0;
      auVar91._0_12_ = SUB1512(auVar90 << 0x20,3);
      auVar81._13_2_ = 0;
      auVar81._0_13_ = SUB1513(auVar91 << 0x18,2);
      auVar81 = auVar81 << 0x10;
      uVar202 = CONCAT12(auVar149[9],(ushort)auVar149[8]);
      auVar203._0_4_ = CONCAT13(0,uVar202);
      auVar14[0xb] = 0;
      auVar14._0_11_ = auVar81._0_11_;
      auVar14[0xc] = auVar149[3];
      auVar71[10] = 0;
      auVar71._0_10_ = auVar81._0_10_;
      auVar71._11_2_ = auVar14._11_2_;
      auVar72[9] = 0;
      auVar72._0_9_ = auVar81._0_9_;
      auVar72._10_3_ = auVar71._10_3_;
      uVar136 = CONCAT41(auVar72._9_4_,auVar149[2]);
      auVar92._5_8_ = 0;
      auVar92._0_5_ = uVar136;
      auVar93._6_7_ = 0;
      auVar93._0_6_ = SUB136(auVar92 << 0x40,7);
      auVar94._7_6_ = 0;
      auVar94._0_7_ = SUB137(auVar93 << 0x38,6);
      Var95 = CONCAT81(SUB138(auVar94 << 0x30,5),auVar149[1]);
      auVar108._9_4_ = 0;
      auVar108._0_9_ = Var95;
      auVar96._10_3_ = 0;
      auVar96._0_10_ = SUB1310(auVar108 << 0x20,3);
      auVar82._2_11_ = SUB1311(auVar96 << 0x18,2);
      auVar82._0_2_ = auVar149._0_2_ & 0xff;
      auVar162._13_3_ = 0;
      auVar162._0_13_ = auVar82;
      auVar156._1_3_ = 0;
      auVar156[0] = bVar179;
      auVar156[4] = uVar180;
      auVar156._5_3_ = 0;
      auVar156[8] = uVar181;
      auVar156._9_3_ = 0;
      auVar156[0xc] = bVar182;
      auVar156._13_3_ = 0;
      auVar193 = pshuflw(in_XMM13,auVar156,0xec);
      auVar153 = auVar156 & _DAT_005614b0 | ~_DAT_005614b0 & auVar162;
      auVar183._0_4_ = auVar153._0_4_;
      auVar183._12_4_ = auVar153._12_4_;
      auVar183._4_4_ = auVar153._8_4_;
      auVar183._8_4_ = auVar153._4_4_;
      auVar153 = pshuflw(auVar183,auVar183,0xc6);
      auVar153 = pshufhw(auVar153,auVar153,0xe6);
      auVar184._0_4_ = auVar153._0_4_;
      auVar184._12_4_ = auVar153._12_4_;
      auVar184._4_4_ = auVar153._8_4_;
      auVar184._8_4_ = auVar153._4_4_;
      auVar185 = pshufhw(auVar184,auVar184,0xc6);
      auVar209._4_4_ = (int)Var95;
      auVar209._0_4_ = (int)uVar136;
      auVar209._8_4_ = auVar82._0_4_;
      auVar209[0xc] = auVar149[3];
      auVar209._13_3_ = 0;
      auVar153 = pshufhw(auVar162,auVar209,0xec);
      auVar163._4_4_ = auVar153._4_4_;
      auVar163._0_4_ = auVar153._8_4_;
      auVar163._8_4_ = auVar163._4_4_;
      auVar163._12_4_ = auVar153._0_4_;
      auVar153 = pshuflw(auVar163,auVar163,0x6c);
      auVar153 = auVar153 & _DAT_005614c0;
      sVar208 = auVar153._0_2_;
      sVar219 = auVar153._2_2_;
      auVar164[1] = (0 < sVar219) * (sVar219 < 0x100) * auVar153[2] - (0xff < sVar219);
      auVar164[0] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0] - (0xff < sVar208);
      sVar208 = auVar153._4_2_;
      auVar164[2] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[4] - (0xff < sVar208);
      sVar208 = auVar153._6_2_;
      auVar164[3] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[6] - (0xff < sVar208);
      sVar208 = auVar153._8_2_;
      auVar164[4] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[8] - (0xff < sVar208);
      sVar208 = auVar153._10_2_;
      auVar164[5] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[10] - (0xff < sVar208);
      sVar208 = auVar153._12_2_;
      auVar164[6] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0xc] - (0xff < sVar208);
      sVar208 = auVar153._14_2_;
      auVar164[7] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0xe] - (0xff < sVar208);
      sVar208 = auVar185._0_2_;
      auVar164[8] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0] - (0xff < sVar208);
      sVar208 = auVar185._2_2_;
      auVar164[9] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[2] - (0xff < sVar208);
      sVar208 = auVar185._4_2_;
      auVar164[10] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[4] - (0xff < sVar208);
      sVar208 = auVar185._6_2_;
      auVar164[0xb] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[6] - (0xff < sVar208);
      sVar208 = auVar185._8_2_;
      auVar164[0xc] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[8] - (0xff < sVar208);
      sVar208 = auVar185._10_2_;
      auVar164[0xd] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[10] - (0xff < sVar208);
      sVar208 = auVar185._12_2_;
      auVar164[0xe] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0xc] - (0xff < sVar208);
      sVar208 = auVar185._14_2_;
      auVar164[0xf] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0xe] - (0xff < sVar208);
      auVar186._0_8_ = auVar193._0_8_;
      auVar186._8_4_ = auVar193._0_4_;
      auVar186._12_4_ = auVar193._12_4_;
      auVar153 = pshufhw(auVar186,auVar186,0xc4);
      in_XMM13 = ~_DAT_005614d0 & auVar153;
      auVar153 = pshuflw(auVar153,auVar209,0xec);
      uVar192 = auVar153._12_4_;
      auVar210._4_4_ = uVar192;
      auVar210._0_4_ = auVar153._0_4_;
      auVar210._8_4_ = uVar192;
      auVar210._12_4_ = uVar192;
      auVar185 = auVar210 & _DAT_005614d0 | in_XMM13;
      auVar157._1_3_ = 0;
      auVar157[0] = bVar182;
      auVar157[4] = uVar180;
      auVar157._5_3_ = 0;
      auVar157[8] = uVar181;
      auVar157._9_3_ = 0;
      auVar157[0xc] = bVar179;
      auVar157._13_3_ = 0;
      auVar153 = pshuflw(auVar157,auVar157,0xe6);
      auVar158._4_4_ = auVar153._4_4_;
      auVar158._8_4_ = auVar153._8_4_;
      auVar158._0_4_ = auVar153._12_4_;
      auVar158._12_4_ = auVar153._0_4_;
      auVar153 = pshufhw(auVar158,auVar158,0xc6);
      sVar208 = auVar185._0_2_;
      sVar219 = auVar185._2_2_;
      auVar211[1] = (0 < sVar219) * (sVar219 < 0x100) * auVar185[2] - (0xff < sVar219);
      auVar211[0] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0] - (0xff < sVar208);
      sVar208 = auVar185._4_2_;
      auVar211[2] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[4] - (0xff < sVar208);
      sVar208 = auVar185._6_2_;
      auVar211[3] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[6] - (0xff < sVar208);
      sVar208 = auVar185._8_2_;
      auVar211[4] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[8] - (0xff < sVar208);
      sVar208 = auVar185._10_2_;
      auVar211[5] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[10] - (0xff < sVar208);
      sVar208 = auVar185._12_2_;
      auVar211[6] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0xc] - (0xff < sVar208);
      sVar208 = auVar185._14_2_;
      auVar211[7] = (0 < sVar208) * (sVar208 < 0x100) * auVar185[0xe] - (0xff < sVar208);
      sVar208 = auVar153._0_2_;
      auVar211[8] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0] - (0xff < sVar208);
      sVar208 = auVar153._2_2_;
      auVar211[9] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[2] - (0xff < sVar208);
      sVar208 = auVar153._4_2_;
      auVar211[10] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[4] - (0xff < sVar208);
      sVar208 = auVar153._6_2_;
      auVar211[0xb] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[6] - (0xff < sVar208);
      sVar208 = auVar153._8_2_;
      auVar211[0xc] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[8] - (0xff < sVar208);
      sVar208 = auVar153._10_2_;
      auVar211[0xd] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[10] - (0xff < sVar208);
      sVar208 = auVar153._12_2_;
      auVar211[0xe] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0xc] - (0xff < sVar208);
      sVar208 = auVar153._14_2_;
      auVar211[0xf] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0xe] - (0xff < sVar208);
      auVar159._8_3_ = uVar202;
      auVar159[0xb] = 0;
      auVar159._12_3_ = uVar30;
      auVar159[0xf] = 0;
      auVar153 = pshuflw(auVar159,auVar159,0x94);
      auVar153 = pshufhw(auVar153,auVar153,0x3e);
      sVar208 = auVar153._0_2_;
      sVar219 = auVar153._2_2_;
      sVar220 = auVar153._4_2_;
      sVar222 = auVar153._6_2_;
      sVar224 = auVar153._8_2_;
      sVar225 = auVar153._10_2_;
      sVar226 = auVar153._12_2_;
      sVar227 = auVar153._14_2_;
      cVar140 = (0 < sVar227) * (sVar227 < 0x100) * auVar153[0xe] - (0xff < sVar227);
      uVar97 = CONCAT11((0 < sVar208) * (sVar208 < 0x100) * auVar153[0] - (0xff < sVar208),cVar140);
      uVar109 = CONCAT12((0 < sVar219) * (sVar219 < 0x100) * auVar153[2] - (0xff < sVar219),uVar97);
      uVar130 = CONCAT13((0 < sVar220) * (sVar220 < 0x100) * auVar153[4] - (0xff < sVar220),uVar109)
      ;
      uVar131 = CONCAT14((0 < sVar222) * (sVar222 < 0x100) * auVar153[6] - (0xff < sVar222),uVar130)
      ;
      auVar134[5] = (0 < sVar224) * (sVar224 < 0x100) * auVar153[8] - (0xff < sVar224);
      auVar134._0_5_ = uVar131;
      auVar134._6_8_ = 0;
      auVar9[0xe] = cVar140;
      auVar9._0_14_ = auVar134 << 0x38;
      auVar132._4_8_ = 0;
      auVar132._0_4_ = uVar130;
      auVar32._12_3_ =
           (int3)(CONCAT26(auVar9._13_2_,
                           CONCAT15((0 < sVar226) * (sVar226 < 0x100) * auVar153[0xc] -
                                    (0xff < sVar226),uVar131)) >> 0x28);
      auVar32._0_12_ = auVar132 << 0x38;
      auVar52._10_5_ =
           (int5)(CONCAT44(auVar32._11_4_,
                           CONCAT13((0 < sVar225) * (sVar225 < 0x100) * auVar153[10] -
                                    (0xff < sVar225),uVar109)) >> 0x18);
      auVar52._0_10_ = (unkuint10)uVar97 << 0x38;
      auVar98._7_8_ = 0;
      auVar98._0_7_ =
           (uint7)(CONCAT62(auVar52._9_6_,
                            CONCAT11((0 < sVar224) * (sVar224 < 0x100) * auVar153[8] -
                                     (0xff < sVar224),cVar140)) >> 8);
      auVar110._1_8_ = SUB158(auVar98 << 0x40,7);
      auVar110[0] = (0 < sVar222) * (sVar222 < 0x100) * auVar153[6] - (0xff < sVar222);
      auVar110._9_6_ = 0;
      auVar111._1_10_ = SUB1510(auVar110 << 0x30,5);
      auVar111[0] = (0 < sVar220) * (sVar220 < 0x100) * auVar153[4] - (0xff < sVar220);
      auVar111._11_4_ = 0;
      auVar160._3_12_ = SUB1512(auVar111 << 0x20,3);
      auVar160[2] = (0 < sVar219) * (sVar219 < 0x100) * auVar153[2] - (0xff < sVar219);
      auVar160[1] = 0;
      auVar160[0] = (0 < sVar208) * (sVar208 < 0x100) * auVar153[0] - (0xff < sVar208);
      auVar160[0xf] = 0;
      auVar6._4_4_ = uVar84;
      auVar6._0_4_ = uVar84;
      auVar6._8_4_ = uVar84;
      auVar6._12_4_ = uVar84;
      auVar193 = pmaddwd(auVar211,auVar6);
      auVar7._4_4_ = uVar85;
      auVar7._0_4_ = uVar85;
      auVar7._8_4_ = uVar85;
      auVar7._12_4_ = uVar85;
      auVar153 = pmaddwd(auVar160,auVar7);
      auVar203._4_3_ = uVar30;
      auVar203[7] = 0;
      auVar203._8_3_ = uVar202;
      auVar203[0xb] = 0;
      auVar203._12_3_ =
           (int3)(CONCAT16(auVar149[0xb],(uint6)CONCAT14(auVar149[10],auVar203._0_4_)) >> 0x20);
      auVar203[0xf] = 0;
      auVar149 = pshuflw(auVar153,auVar203,0x3e);
      auVar149 = pshufhw(auVar149,auVar149,0x94);
      sVar208 = auVar149._0_2_;
      sVar219 = auVar149._2_2_;
      sVar220 = auVar149._4_2_;
      sVar222 = auVar149._6_2_;
      sVar224 = auVar149._8_2_;
      sVar225 = auVar149._10_2_;
      sVar226 = auVar149._12_2_;
      sVar227 = auVar149._14_2_;
      cVar140 = (0 < sVar227) * (sVar227 < 0x100) * auVar149[0xe] - (0xff < sVar227);
      uVar97 = CONCAT11((0 < sVar208) * (sVar208 < 0x100) * auVar149[0] - (0xff < sVar208),cVar140);
      uVar30 = CONCAT12((0 < sVar219) * (sVar219 < 0x100) * auVar149[2] - (0xff < sVar219),uVar97);
      uVar130 = CONCAT13((0 < sVar220) * (sVar220 < 0x100) * auVar149[4] - (0xff < sVar220),uVar30);
      uVar131 = CONCAT14((0 < sVar222) * (sVar222 < 0x100) * auVar149[6] - (0xff < sVar222),uVar130)
      ;
      auVar135[5] = (0 < sVar224) * (sVar224 < 0x100) * auVar149[8] - (0xff < sVar224);
      auVar135._0_5_ = uVar131;
      auVar135._6_8_ = 0;
      auVar10[0xe] = cVar140;
      auVar10._0_14_ = auVar135 << 0x38;
      auVar133._4_8_ = 0;
      auVar133._0_4_ = uVar130;
      auVar33._12_3_ =
           (int3)(CONCAT26(auVar10._13_2_,
                           CONCAT15((0 < sVar226) * (sVar226 < 0x100) * auVar149[0xc] -
                                    (0xff < sVar226),uVar131)) >> 0x28);
      auVar33._0_12_ = auVar133 << 0x38;
      auVar53._10_5_ =
           (int5)(CONCAT44(auVar33._11_4_,
                           CONCAT13((0 < sVar225) * (sVar225 < 0x100) * auVar149[10] -
                                    (0xff < sVar225),uVar30)) >> 0x18);
      auVar53._0_10_ = (unkuint10)uVar97 << 0x38;
      auVar99._7_8_ = 0;
      auVar99._0_7_ =
           (uint7)(CONCAT62(auVar53._9_6_,
                            CONCAT11((0 < sVar224) * (sVar224 < 0x100) * auVar149[8] -
                                     (0xff < sVar224),cVar140)) >> 8);
      auVar112._1_8_ = SUB158(auVar99 << 0x40,7);
      auVar112[0] = (0 < sVar222) * (sVar222 < 0x100) * auVar149[6] - (0xff < sVar222);
      auVar112._9_6_ = 0;
      auVar113._1_10_ = SUB1510(auVar112 << 0x30,5);
      auVar113[0] = (0 < sVar220) * (sVar220 < 0x100) * auVar149[4] - (0xff < sVar220);
      auVar113._11_4_ = 0;
      auVar161._3_12_ = SUB1512(auVar113 << 0x20,3);
      auVar161[2] = (0 < sVar219) * (sVar219 < 0x100) * auVar149[2] - (0xff < sVar219);
      auVar161[1] = 0;
      auVar161[0] = (0 < sVar208) * (sVar208 < 0x100) * auVar149[0] - (0xff < sVar208);
      auVar161[0xf] = 0;
      auVar149 = pmaddwd(auVar161,auVar155);
      auVar5._4_4_ = uVar83;
      auVar5._0_4_ = uVar83;
      auVar5._8_4_ = uVar83;
      auVar5._12_4_ = uVar83;
      auVar185 = pmaddwd(auVar164,auVar5);
      auVar212._4_4_ =
           auVar193._4_4_ + iVar146 + auVar153._4_4_ + auVar149._4_4_ + auVar185._4_4_ >> auVar147;
      auVar212._8_4_ =
           auVar193._8_4_ + iVar146 + auVar153._8_4_ + auVar149._8_4_ + auVar185._8_4_ >> auVar147;
      auVar212._12_4_ =
           auVar193._12_4_ + iVar146 + auVar153._12_4_ + auVar149._12_4_ + auVar185._12_4_ >>
           auVar147;
      auVar212._0_4_ =
           (auVar193._0_4_ + iVar146 + auVar153._0_4_ + auVar149._0_4_ + auVar185._0_4_ >> auVar147)
           << iVar142;
      auVar149 = packssdw(auVar212,auVar212);
      sVar208 = auVar149._0_2_ + sVar151;
      sVar219 = auVar149._2_2_ + sVar150;
      sVar220 = auVar149._4_2_ + sVar151;
      sVar222 = auVar149._6_2_ + sVar150;
      sVar224 = auVar149._8_2_ + sVar151;
      sVar225 = auVar149._10_2_ + sVar150;
      sVar226 = auVar149._12_2_ + sVar151;
      sVar227 = auVar149._14_2_ + sVar150;
      if (iVar141 == 0) {
        *(short *)*pauVar143 = sVar208;
        *(short *)(*pauVar143 + 2) = sVar219;
        *(short *)(*pauVar143 + 4) = sVar220;
        *(short *)(*pauVar143 + 6) = sVar222;
        *(short *)(*pauVar143 + 8) = sVar224;
        *(short *)(*pauVar143 + 10) = sVar225;
        *(short *)(*pauVar143 + 0xc) = sVar226;
        *(short *)(*pauVar143 + 0xe) = sVar227;
      }
      else {
        auVar149 = *pauVar143;
        if (iVar4 == 0) {
          auVar213._0_2_ = sVar208 + auVar149._0_2_;
          auVar213._2_2_ = sVar219 + auVar149._2_2_;
          auVar213._4_2_ = sVar220 + auVar149._4_2_;
          auVar213._6_2_ = sVar222 + auVar149._6_2_;
          auVar213._8_2_ = sVar224 + auVar149._8_2_;
          auVar213._10_2_ = sVar225 + auVar149._10_2_;
          auVar213._12_2_ = sVar226 + auVar149._12_2_;
          auVar213._14_2_ = sVar227 + auVar149._14_2_;
          auVar149 = psraw(auVar213,1);
        }
        else {
          auVar168._0_12_ = auVar149._0_12_;
          auVar168._12_2_ = auVar149._6_2_;
          auVar168._14_2_ = sVar222;
          auVar167._12_4_ = auVar168._12_4_;
          auVar167._0_10_ = auVar149._0_10_;
          auVar167._10_2_ = sVar220;
          auVar166._10_6_ = auVar167._10_6_;
          auVar166._0_8_ = auVar149._0_8_;
          auVar166._8_2_ = auVar149._4_2_;
          auVar165._8_8_ = auVar166._8_8_;
          auVar165._6_2_ = sVar219;
          auVar165._4_2_ = auVar149._2_2_;
          auVar165._2_2_ = sVar208;
          auVar165._0_2_ = auVar149._0_2_;
          auVar187._2_2_ = sVar224;
          auVar187._0_2_ = auVar149._8_2_;
          auVar187._4_2_ = auVar149._10_2_;
          auVar187._6_2_ = sVar225;
          auVar187._8_2_ = auVar149._12_2_;
          auVar187._10_2_ = sVar226;
          auVar187._12_2_ = auVar149._14_2_;
          auVar187._14_2_ = sVar227;
          auVar149 = pmaddwd(auVar165,auVar148);
          auVar153 = pmaddwd(auVar187,auVar148);
          auVar169._0_4_ = auVar149._0_4_ >> 4;
          auVar169._4_4_ = auVar149._4_4_ >> 4;
          auVar169._8_4_ = auVar149._8_4_ >> 4;
          auVar169._12_4_ = auVar149._12_4_ >> 4;
          auVar188._0_4_ = auVar153._0_4_ >> 4;
          auVar188._4_4_ = auVar153._4_4_ >> 4;
          auVar188._8_4_ = auVar153._8_4_ >> 4;
          auVar188._12_4_ = auVar153._12_4_ >> 4;
          auVar149 = packssdw(auVar169,auVar188);
        }
        auVar170._0_2_ = auVar149._0_2_ + (sVar152 - sVar151);
        auVar170._2_2_ = auVar149._2_2_ + (sVar154 - sVar150);
        auVar170._4_2_ = auVar149._4_2_ + (sVar152 - sVar151);
        auVar170._6_2_ = auVar149._6_2_ + (sVar154 - sVar150);
        auVar170._8_2_ = auVar149._8_2_ + (sVar152 - sVar151);
        auVar170._10_2_ = auVar149._10_2_ + (sVar154 - sVar150);
        auVar170._12_2_ = auVar149._12_2_ + (sVar152 - sVar151);
        auVar170._14_2_ = auVar149._14_2_ + (sVar154 - sVar150);
        auVar149 = psraw(auVar170,ZEXT416(uVar137));
        sVar208 = auVar149._0_2_;
        sVar219 = auVar149._2_2_;
        sVar220 = auVar149._4_2_;
        sVar222 = auVar149._6_2_;
        *(uint *)dst0 =
             CONCAT13((0 < sVar222) * (sVar222 < 0x100) * auVar149[6] - (0xff < sVar222),
                      CONCAT12((0 < sVar220) * (sVar220 < 0x100) * auVar149[4] - (0xff < sVar220),
                               CONCAT11((0 < sVar219) * (sVar219 < 0x100) * auVar149[2] -
                                        (0xff < sVar219),
                                        (0 < sVar208) * (sVar208 < 0x100) * auVar149[0] -
                                        (0xff < sVar208))));
      }
      pauVar138 = (undefined1 (*) [16])(*pauVar138 + src_stride);
      dst0 = dst0 + dst_stride0;
      pauVar143 = (undefined1 (*) [16])(*pauVar143 + (long)iVar3 * 2);
      h = h + -1;
    } while (h != 0);
  }
  else {
    uVar144 = 1;
    if (1 < h) {
      uVar144 = (ulong)(uint)h;
    }
    uVar139 = 0;
    do {
      lVar145 = 0;
      do {
        auVar149 = *(undefined1 (*) [16])(*pauVar138 + lVar145);
        uVar201 = auVar149[7];
        auVar11[0xd] = 0;
        auVar11._0_13_ = auVar149._0_13_;
        auVar11[0xe] = uVar201;
        uVar200 = auVar149[6];
        auVar21[0xc] = uVar200;
        auVar21._0_12_ = auVar149._0_12_;
        auVar21._13_2_ = auVar11._13_2_;
        auVar34[0xb] = 0;
        auVar34._0_11_ = auVar149._0_11_;
        auVar34._12_3_ = auVar21._12_3_;
        uVar199 = auVar149[5];
        auVar43[10] = uVar199;
        auVar43._0_10_ = auVar149._0_10_;
        auVar43._11_4_ = auVar34._11_4_;
        auVar54[9] = 0;
        auVar54._0_9_ = auVar149._0_9_;
        auVar54._10_5_ = auVar43._10_5_;
        uVar198 = auVar149[4];
        auVar63[8] = uVar198;
        auVar63._0_8_ = auVar149._0_8_;
        auVar63._9_6_ = auVar54._9_6_;
        auVar100._7_8_ = 0;
        auVar100._0_7_ = auVar63._8_7_;
        uVar181 = auVar149[3];
        auVar114._1_8_ = SUB158(auVar100 << 0x40,7);
        auVar114[0] = uVar181;
        auVar114._9_6_ = 0;
        auVar115._1_10_ = SUB1510(auVar114 << 0x30,5);
        auVar115[0] = auVar149[2];
        auVar115._11_4_ = 0;
        auVar73[2] = auVar149[1];
        auVar73._0_2_ = auVar149._0_2_;
        auVar73._3_12_ = SUB1512(auVar115 << 0x20,3);
        auVar194._0_2_ = auVar149._0_2_ & 0xff;
        auVar194._2_13_ = auVar73._2_13_;
        auVar194[0xf] = 0;
        uVar207 = auVar149[9];
        auVar12[0xd] = 0;
        auVar12._0_13_ = auVar149._2_13_;
        auVar12[0xe] = uVar207;
        uVar206 = auVar149[8];
        auVar22[0xc] = uVar206;
        auVar22._0_12_ = auVar149._2_12_;
        auVar22._13_2_ = auVar12._13_2_;
        auVar35[0xb] = 0;
        auVar35._0_11_ = auVar149._2_11_;
        auVar35._12_3_ = auVar22._12_3_;
        auVar44[10] = uVar201;
        auVar44._0_10_ = auVar149._2_10_;
        auVar44._11_4_ = auVar35._11_4_;
        auVar55[9] = 0;
        auVar55._0_9_ = auVar149._2_9_;
        auVar55._10_5_ = auVar44._10_5_;
        auVar64[8] = uVar200;
        auVar64._0_8_ = auVar149._2_8_;
        auVar64._9_6_ = auVar55._9_6_;
        auVar101._7_8_ = 0;
        auVar101._0_7_ = auVar64._8_7_;
        auVar116._1_8_ = SUB158(auVar101 << 0x40,7);
        auVar116[0] = uVar199;
        auVar116._9_6_ = 0;
        auVar117._1_10_ = SUB1510(auVar116 << 0x30,5);
        auVar117[0] = uVar198;
        auVar117._11_4_ = 0;
        auVar74[2] = uVar181;
        auVar74._0_2_ = auVar149._2_2_;
        auVar74._3_12_ = SUB1512(auVar117 << 0x20,3);
        auVar204._0_2_ = auVar149._2_2_ & 0xff;
        auVar204._2_13_ = auVar74._2_13_;
        auVar204[0xf] = 0;
        auVar214._0_12_ = auVar149._4_12_;
        auVar214._12_4_ = auVar149._12_4_;
        uVar223 = auVar149[0xb];
        auVar13[0xd] = 0;
        auVar13._0_13_ = auVar214._0_13_;
        auVar13[0xe] = uVar223;
        uVar221 = auVar149[10];
        auVar23[0xc] = uVar221;
        auVar23._0_12_ = auVar214._0_12_;
        auVar23._13_2_ = auVar13._13_2_;
        auVar36[0xb] = 0;
        auVar36._0_11_ = auVar149._4_11_;
        auVar36._12_3_ = auVar23._12_3_;
        auVar45[10] = uVar207;
        auVar45._0_10_ = auVar149._4_10_;
        auVar45._11_4_ = auVar36._11_4_;
        auVar56[9] = 0;
        auVar56._0_9_ = auVar149._4_9_;
        auVar56._10_5_ = auVar45._10_5_;
        auVar65[8] = uVar206;
        auVar65._0_8_ = auVar149._4_8_;
        auVar65._9_6_ = auVar56._9_6_;
        auVar102._7_8_ = 0;
        auVar102._0_7_ = auVar65._8_7_;
        auVar118._1_8_ = SUB158(auVar102 << 0x40,7);
        auVar118[0] = uVar201;
        auVar118._9_6_ = 0;
        auVar119._1_10_ = SUB1510(auVar118 << 0x30,5);
        auVar119[0] = uVar200;
        auVar119._11_4_ = 0;
        auVar75[2] = uVar199;
        auVar75._0_2_ = auVar149._4_2_;
        auVar75._3_12_ = SUB1512(auVar119 << 0x20,3);
        auVar215._0_2_ = auVar149._4_2_ & 0xff;
        auVar215._2_13_ = auVar75._2_13_;
        auVar215[0xf] = 0;
        auVar14 = auVar149._3_13_;
        auVar15[0xd] = 0;
        auVar15._0_13_ = auVar14 >> 0x18;
        auVar15[0xe] = auVar149[0xd];
        uVar180 = auVar149[0xc];
        auVar25[0xc] = uVar180;
        auVar25._0_12_ = auVar214._0_12_ >> 0x10;
        auVar25._13_2_ = auVar15._13_2_;
        auVar24 = auVar149._5_11_;
        auVar37[0xb] = 0;
        auVar37._0_11_ = auVar24 >> 8;
        auVar37._12_3_ = auVar25._12_3_;
        auVar46[10] = uVar223;
        auVar46._0_10_ = auVar149._6_10_;
        auVar46._11_4_ = auVar37._11_4_;
        auVar57[9] = 0;
        auVar57._0_9_ = auVar149._6_9_;
        auVar57._10_5_ = auVar46._10_5_;
        auVar66[8] = uVar221;
        auVar66._0_8_ = auVar149._6_8_;
        auVar66._9_6_ = auVar57._9_6_;
        auVar103._7_8_ = 0;
        auVar103._0_7_ = auVar66._8_7_;
        auVar120._1_8_ = SUB158(auVar103 << 0x40,7);
        auVar120[0] = uVar207;
        auVar120._9_6_ = 0;
        auVar121._1_10_ = SUB1510(auVar120 << 0x30,5);
        auVar121[0] = uVar206;
        auVar121._11_4_ = 0;
        auVar76[2] = uVar201;
        auVar76._0_2_ = auVar149._6_2_;
        auVar76._3_12_ = SUB1512(auVar121 << 0x20,3);
        auVar171._0_2_ = auVar149._6_2_ & 0xff;
        auVar171._2_13_ = auVar76._2_13_;
        auVar171[0xf] = 0;
        auVar153._4_4_ = uVar83;
        auVar153._0_4_ = uVar83;
        auVar153._8_4_ = uVar83;
        auVar153._12_4_ = uVar83;
        auVar194 = pmaddwd(auVar194,auVar153);
        auVar185._4_4_ = uVar84;
        auVar185._0_4_ = uVar84;
        auVar185._8_4_ = uVar84;
        auVar185._12_4_ = uVar84;
        auVar204 = pmaddwd(auVar204,auVar185);
        auVar216._4_4_ = uVar85;
        auVar216._0_4_ = uVar85;
        auVar216._8_4_ = uVar85;
        auVar216._12_4_ = uVar85;
        auVar216 = pmaddwd(auVar215,auVar216);
        auVar153 = pmaddwd(auVar171,auVar155);
        auVar16[0xd] = 0;
        auVar16._0_13_ = auVar149._1_13_;
        auVar16[0xe] = uVar206;
        auVar26[0xc] = uVar201;
        auVar26._0_12_ = auVar149._1_12_;
        auVar26._13_2_ = auVar16._13_2_;
        auVar38[0xb] = 0;
        auVar38._0_11_ = auVar149._1_11_;
        auVar38._12_3_ = auVar26._12_3_;
        auVar47[10] = uVar200;
        auVar47._0_10_ = auVar149._1_10_;
        auVar47._11_4_ = auVar38._11_4_;
        auVar58[9] = 0;
        auVar58._0_9_ = auVar149._1_9_;
        auVar58._10_5_ = auVar47._10_5_;
        auVar67[8] = uVar199;
        auVar67._0_8_ = auVar149._1_8_;
        auVar67._9_6_ = auVar58._9_6_;
        auVar104._7_8_ = 0;
        auVar104._0_7_ = auVar67._8_7_;
        auVar122._1_8_ = SUB158(auVar104 << 0x40,7);
        auVar122[0] = uVar198;
        auVar122._9_6_ = 0;
        auVar123._1_10_ = SUB1510(auVar122 << 0x30,5);
        auVar123[0] = uVar181;
        auVar123._11_4_ = 0;
        auVar77[2] = auVar149[2];
        auVar77._0_2_ = auVar149._1_2_;
        auVar77._3_12_ = SUB1512(auVar123 << 0x20,3);
        auVar195._0_2_ = auVar149._1_2_ & 0xff;
        auVar195._2_13_ = auVar77._2_13_;
        auVar195[0xf] = 0;
        auVar17[0xd] = 0;
        auVar17._0_13_ = auVar14;
        auVar17[0xe] = uVar221;
        auVar27[0xc] = uVar207;
        auVar27._0_12_ = auVar149._3_12_;
        auVar27._13_2_ = auVar17._13_2_;
        auVar39[0xb] = 0;
        auVar39._0_11_ = auVar149._3_11_;
        auVar39._12_3_ = auVar27._12_3_;
        auVar48[10] = uVar206;
        auVar48._0_10_ = auVar149._3_10_;
        auVar48._11_4_ = auVar39._11_4_;
        auVar59[9] = 0;
        auVar59._0_9_ = auVar149._3_9_;
        auVar59._10_5_ = auVar48._10_5_;
        auVar68[8] = uVar201;
        auVar68._0_8_ = auVar149._3_8_;
        auVar68._9_6_ = auVar59._9_6_;
        auVar105._7_8_ = 0;
        auVar105._0_7_ = auVar68._8_7_;
        auVar124._1_8_ = SUB158(auVar105 << 0x40,7);
        auVar124[0] = uVar200;
        auVar124._9_6_ = 0;
        auVar125._1_10_ = SUB1510(auVar124 << 0x30,5);
        auVar125[0] = uVar199;
        auVar125._11_4_ = 0;
        auVar78[2] = uVar198;
        auVar78._0_2_ = auVar149._3_2_;
        auVar78._3_12_ = SUB1512(auVar125 << 0x20,3);
        auVar205._0_2_ = auVar149._3_2_ & 0xff;
        auVar205._2_13_ = auVar78._2_13_;
        auVar205[0xf] = 0;
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar14 >> 0x10;
        auVar18[0xe] = uVar180;
        auVar28[0xc] = uVar223;
        auVar28._0_12_ = auVar214._0_12_ >> 8;
        auVar28._13_2_ = auVar18._13_2_;
        auVar40[0xb] = 0;
        auVar40._0_11_ = auVar24;
        auVar40._12_3_ = auVar28._12_3_;
        auVar49[10] = uVar221;
        auVar49._0_10_ = auVar149._5_10_;
        auVar49._11_4_ = auVar40._11_4_;
        auVar60[9] = 0;
        auVar60._0_9_ = auVar149._5_9_;
        auVar60._10_5_ = auVar49._10_5_;
        auVar69[8] = uVar207;
        auVar69._0_8_ = auVar149._5_8_;
        auVar69._9_6_ = auVar60._9_6_;
        auVar106._7_8_ = 0;
        auVar106._0_7_ = auVar69._8_7_;
        auVar126._1_8_ = SUB158(auVar106 << 0x40,7);
        auVar126[0] = uVar206;
        auVar126._9_6_ = 0;
        auVar127._1_10_ = SUB1510(auVar126 << 0x30,5);
        auVar127[0] = uVar201;
        auVar127._11_4_ = 0;
        auVar79[2] = uVar200;
        auVar79._0_2_ = auVar149._5_2_;
        auVar79._3_12_ = SUB1512(auVar127 << 0x20,3);
        auVar217._0_2_ = auVar149._5_2_ & 0xff;
        auVar217._2_13_ = auVar79._2_13_;
        auVar217[0xf] = 0;
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar14 >> 0x20;
        auVar19[0xe] = auVar149[0xe];
        auVar29[0xc] = auVar149[0xd];
        auVar29._0_12_ = auVar214._0_12_ >> 0x18;
        auVar29._13_2_ = auVar19._13_2_;
        auVar41[0xb] = 0;
        auVar41._0_11_ = auVar24 >> 0x10;
        auVar41._12_3_ = auVar29._12_3_;
        auVar50[10] = uVar180;
        auVar50._0_10_ = auVar149._6_10_ >> 8;
        auVar50._11_4_ = auVar41._11_4_;
        auVar61[9] = 0;
        auVar61._0_9_ = auVar149._7_9_;
        auVar61._10_5_ = auVar50._10_5_;
        auVar70[8] = uVar223;
        auVar70._0_8_ = auVar149._7_8_;
        auVar70._9_6_ = auVar61._9_6_;
        auVar107._7_8_ = 0;
        auVar107._0_7_ = auVar70._8_7_;
        auVar128._1_8_ = SUB158(auVar107 << 0x40,7);
        auVar128[0] = uVar221;
        auVar128._9_6_ = 0;
        auVar129._1_10_ = SUB1510(auVar128 << 0x30,5);
        auVar129[0] = uVar207;
        auVar129._11_4_ = 0;
        auVar80[2] = uVar206;
        auVar80._0_2_ = auVar149._7_2_;
        auVar80._3_12_ = SUB1512(auVar129 << 0x20,3);
        auVar189._0_2_ = auVar149._7_2_ & 0xff;
        auVar189._2_13_ = auVar80._2_13_;
        auVar189[0xf] = 0;
        auVar149._4_4_ = uVar83;
        auVar149._0_4_ = uVar83;
        auVar149._8_4_ = uVar83;
        auVar149._12_4_ = uVar83;
        auVar185 = pmaddwd(auVar195,auVar149);
        auVar193._4_4_ = uVar84;
        auVar193._0_4_ = uVar84;
        auVar193._8_4_ = uVar84;
        auVar193._12_4_ = uVar84;
        auVar193 = pmaddwd(auVar205,auVar193);
        auVar218._4_4_ = uVar85;
        auVar218._0_4_ = uVar85;
        auVar218._8_4_ = uVar85;
        auVar218._12_4_ = uVar85;
        auVar218 = pmaddwd(auVar217,auVar218);
        auVar149 = pmaddwd(auVar189,auVar155);
        auVar196._4_4_ =
             auVar149._0_4_ + auVar218._0_4_ + auVar193._0_4_ + auVar185._0_4_ + iVar146 >> auVar147
        ;
        auVar196._8_4_ =
             auVar153._4_4_ + auVar216._4_4_ + auVar204._4_4_ + auVar194._4_4_ + iVar146 >> auVar147
        ;
        auVar196._12_4_ =
             auVar149._4_4_ + auVar218._4_4_ + auVar193._4_4_ + auVar185._4_4_ + iVar146 >> auVar147
        ;
        auVar172._4_4_ =
             auVar149._8_4_ + auVar218._8_4_ + auVar193._8_4_ + auVar185._8_4_ + iVar146 >> auVar147
        ;
        auVar172._8_4_ =
             auVar153._12_4_ + auVar216._12_4_ + auVar204._12_4_ + auVar194._12_4_ + iVar146 >>
             auVar147;
        auVar172._12_4_ =
             auVar149._12_4_ + auVar218._12_4_ + auVar193._12_4_ + auVar185._12_4_ + iVar146 >>
             auVar147;
        auVar196._0_4_ =
             (auVar153._0_4_ + auVar216._0_4_ + auVar204._0_4_ + auVar194._0_4_ + iVar146 >>
             auVar147) << iVar142;
        auVar172._0_4_ =
             (auVar153._8_4_ + auVar216._8_4_ + auVar204._8_4_ + auVar194._8_4_ + iVar146 >>
             auVar147) << iVar142;
        auVar149 = packssdw(auVar196,auVar172);
        sVar208 = auVar149._0_2_ + sVar151;
        sVar219 = auVar149._2_2_ + sVar150;
        sVar220 = auVar149._4_2_ + sVar151;
        sVar222 = auVar149._6_2_ + sVar150;
        sVar224 = auVar149._8_2_ + sVar151;
        sVar225 = auVar149._10_2_ + sVar150;
        sVar226 = auVar149._12_2_ + sVar151;
        sVar227 = auVar149._14_2_ + sVar150;
        if (iVar141 == 0) {
          psVar2 = (short *)(*pauVar143 + lVar145 * 2);
          *psVar2 = sVar208;
          psVar2[1] = sVar219;
          psVar2[2] = sVar220;
          psVar2[3] = sVar222;
          psVar2[4] = sVar224;
          psVar2[5] = sVar225;
          psVar2[6] = sVar226;
          psVar2[7] = sVar227;
        }
        else {
          auVar149 = *(undefined1 (*) [16])(*pauVar143 + lVar145 * 2);
          if (iVar4 == 0) {
            auVar197._0_2_ = sVar208 + auVar149._0_2_;
            auVar197._2_2_ = sVar219 + auVar149._2_2_;
            auVar197._4_2_ = sVar220 + auVar149._4_2_;
            auVar197._6_2_ = sVar222 + auVar149._6_2_;
            auVar197._8_2_ = sVar224 + auVar149._8_2_;
            auVar197._10_2_ = sVar225 + auVar149._10_2_;
            auVar197._12_2_ = sVar226 + auVar149._12_2_;
            auVar197._14_2_ = sVar227 + auVar149._14_2_;
            auVar149 = psraw(auVar197,1);
          }
          else {
            auVar176._0_12_ = auVar149._0_12_;
            auVar176._12_2_ = auVar149._6_2_;
            auVar176._14_2_ = sVar222;
            auVar175._12_4_ = auVar176._12_4_;
            auVar175._0_10_ = auVar149._0_10_;
            auVar175._10_2_ = sVar220;
            auVar174._10_6_ = auVar175._10_6_;
            auVar174._0_8_ = auVar149._0_8_;
            auVar174._8_2_ = auVar149._4_2_;
            auVar173._8_8_ = auVar174._8_8_;
            auVar173._6_2_ = sVar219;
            auVar173._4_2_ = auVar149._2_2_;
            auVar173._2_2_ = sVar208;
            auVar173._0_2_ = auVar149._0_2_;
            auVar190._2_2_ = sVar224;
            auVar190._0_2_ = auVar149._8_2_;
            auVar190._4_2_ = auVar149._10_2_;
            auVar190._6_2_ = sVar225;
            auVar190._8_2_ = auVar149._12_2_;
            auVar190._10_2_ = sVar226;
            auVar190._12_2_ = auVar149._14_2_;
            auVar190._14_2_ = sVar227;
            auVar149 = pmaddwd(auVar173,auVar148);
            auVar153 = pmaddwd(auVar190,auVar148);
            auVar177._0_4_ = auVar149._0_4_ >> 4;
            auVar177._4_4_ = auVar149._4_4_ >> 4;
            auVar177._8_4_ = auVar149._8_4_ >> 4;
            auVar177._12_4_ = auVar149._12_4_ >> 4;
            auVar191._0_4_ = auVar153._0_4_ >> 4;
            auVar191._4_4_ = auVar153._4_4_ >> 4;
            auVar191._8_4_ = auVar153._8_4_ >> 4;
            auVar191._12_4_ = auVar153._12_4_ >> 4;
            auVar149 = packssdw(auVar177,auVar191);
          }
          auVar178._0_2_ = auVar149._0_2_ + (sVar152 - sVar151);
          auVar178._2_2_ = auVar149._2_2_ + (sVar154 - sVar150);
          auVar178._4_2_ = auVar149._4_2_ + (sVar152 - sVar151);
          auVar178._6_2_ = auVar149._6_2_ + (sVar154 - sVar150);
          auVar178._8_2_ = auVar149._8_2_ + (sVar152 - sVar151);
          auVar178._10_2_ = auVar149._10_2_ + (sVar154 - sVar150);
          auVar178._12_2_ = auVar149._12_2_ + (sVar152 - sVar151);
          auVar178._14_2_ = auVar149._14_2_ + (sVar154 - sVar150);
          auVar149 = psraw(auVar178,ZEXT416(uVar137));
          sVar208 = auVar149._0_2_;
          sVar219 = auVar149._2_2_;
          sVar220 = auVar149._4_2_;
          sVar222 = auVar149._6_2_;
          sVar224 = auVar149._8_2_;
          sVar225 = auVar149._10_2_;
          sVar226 = auVar149._12_2_;
          sVar227 = auVar149._14_2_;
          *(ulong *)(dst0 + lVar145) =
               CONCAT17((0 < sVar227) * (sVar227 < 0x100) * auVar149[0xe] - (0xff < sVar227),
                        CONCAT16((0 < sVar226) * (sVar226 < 0x100) * auVar149[0xc] -
                                 (0xff < sVar226),
                                 CONCAT15((0 < sVar225) * (sVar225 < 0x100) * auVar149[10] -
                                          (0xff < sVar225),
                                          CONCAT14((0 < sVar224) * (sVar224 < 0x100) * auVar149[8] -
                                                   (0xff < sVar224),
                                                   CONCAT13((0 < sVar222) * (sVar222 < 0x100) *
                                                            auVar149[6] - (0xff < sVar222),
                                                            CONCAT12((0 < sVar220) *
                                                                     (sVar220 < 0x100) * auVar149[4]
                                                                     - (0xff < sVar220),
                                                                     CONCAT11((0 < sVar219) *
                                                                              (sVar219 < 0x100) *
                                                                              auVar149[2] -
                                                                              (0xff < sVar219),
                                                                              (0 < sVar208) *
                                                                              (sVar208 < 0x100) *
                                                                              auVar149[0] -
                                                                              (0xff < sVar208)))))))
                       );
        }
        lVar145 = lVar145 + 8;
      } while (lVar145 < w);
      uVar139 = uVar139 + 1;
      dst0 = dst0 + dst_stride0;
      pauVar138 = (undefined1 (*) [16])(*pauVar138 + src_stride);
      pauVar143 = (undefined1 (*) [16])(*pauVar143 + (long)iVar3 * 2);
    } while (uVar139 != uVar144);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_0) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

  if (w == 4) {
    do {
      const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
      __m128i s[4];

      s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
      s[1] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
      s[2] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
      s[3] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
      const __m128i res_lo = convolve_lo_x(s, coeffs);
      const __m128i res_lo_round =
          _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
      const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);

      const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_lo_shift);
      const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);
      } else {
        _mm_store_si128((__m128i *)(&dst[0]), res_unsigned);
      }
      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    } while (--h);
  } else {
    assert(!(w % 8));
    int i = 0;
    do {
      int j = 0;
      do {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        __m128i s[4];

        // Filter even-index pixels
        s[0] = data;
        s[1] = _mm_srli_si128(data, 2);
        s[2] = _mm_srli_si128(data, 4);
        s[3] = _mm_srli_si128(data, 6);
        const __m128i res_even = convolve_lo_x(s, coeffs);

        // Filter odd-index pixels
        s[0] = _mm_srli_si128(data, 1);
        s[1] = _mm_srli_si128(data, 3);
        s[2] = _mm_srli_si128(data, 5);
        s[3] = _mm_srli_si128(data, 7);
        const __m128i res_odd = convolve_lo_x(s, coeffs);

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
        const __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);
        const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);
        const __m128i res_hi_shift = _mm_sll_epi32(res_hi_round, left_shift);

        const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        j += 8;
      } while (j < w);
    } while (++i < h);
  }
}